

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_eval(Nvim *this,string *expr)

{
  allocator local_39;
  string local_38;
  string *local_18;
  string *expr_local;
  Nvim *this_local;
  
  local_18 = expr;
  expr_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_eval",&local_39);
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_eval(const std::string& expr) {
    client_.async_call("nvim_eval", expr);
}